

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O3

void drft_forward(drft_lookup *l,float *data)

{
  int iVar1;
  int ip;
  int *piVar2;
  float *cc;
  bool bVar3;
  int l1;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  iVar1 = l->n;
  lVar8 = (long)iVar1;
  if (lVar8 != 1) {
    piVar2 = l->splitcache;
    lVar9 = (long)piVar2[1];
    if (0 < lVar9) {
      cc = l->trigcache;
      iVar6 = 1;
      iVar4 = iVar1;
      iVar10 = iVar1;
      do {
        ip = piVar2[lVar9 + 1];
        l1 = iVar4 / ip;
        iVar4 = iVar1 / iVar4;
        iVar10 = iVar10 - (ip + -1) * iVar4;
        lVar5 = (long)iVar10;
        if (ip == 2) {
          if (iVar6 == 1) {
            dradf2(iVar4,l1,data,cc,cc + lVar8 + lVar5 + -1);
            goto LAB_001dc0a9;
          }
          dradf2(iVar4,l1,cc,data,cc + lVar8 + lVar5 + -1);
LAB_001dc0ed:
          iVar6 = 1;
          bVar3 = false;
        }
        else {
          if (ip != 4) {
            iVar7 = 1 - iVar6;
            if (iVar4 == 1) {
              iVar7 = iVar6;
            }
            if (iVar7 != 0) {
              dradfg(iVar4,ip,l1,l1 * iVar4,cc,cc,cc,data,data,cc + lVar8 + lVar5 + -1);
              goto LAB_001dc0a9;
            }
            dradfg(iVar4,ip,l1,l1 * iVar4,data,data,data,cc,cc,cc + lVar8 + lVar5 + -1);
            goto LAB_001dc0ed;
          }
          if (iVar6 != 1) {
            dradf4(iVar4,l1,cc,data,cc + lVar8 + lVar5 + -1,cc + lVar8 + (long)(iVar10 + iVar4) + -1
                   ,cc + lVar8 + (long)(iVar4 + iVar10 + iVar4) + -1);
            goto LAB_001dc0ed;
          }
          dradf4(iVar4,l1,data,cc,cc + lVar8 + lVar5 + -1,cc + lVar8 + (long)(iVar10 + iVar4) + -1,
                 cc + lVar8 + (long)(iVar4 + iVar10 + iVar4) + -1);
LAB_001dc0a9:
          iVar6 = 0;
          bVar3 = true;
        }
        lVar9 = lVar9 + -1;
        iVar4 = l1;
      } while (lVar9 != 0);
      if (bVar3 && 0 < iVar1) {
        lVar9 = 0;
        do {
          data[lVar9] = cc[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
      }
    }
  }
  return;
}

Assistant:

void drft_forward(drft_lookup *l,float *data){
  if(l->n==1)return;
  drftf1(l->n,data,l->trigcache,l->trigcache+l->n,l->splitcache);
}